

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::TestTextureCube::TestTextureCube
          (TestTextureCube *this,CompressedTexFormat *format,int size)

{
  TextureFormat *pTVar1;
  int *piVar2;
  int *piVar3;
  CubeFace face;
  pointer pPVar4;
  TextureFormat TVar5;
  undefined8 uVar6;
  ChannelOrder CVar7;
  ChannelType CVar8;
  TestTextureCube *this_00;
  int iVar9;
  long lVar10;
  long lVar11;
  int levelNdx;
  long lVar12;
  long lVar13;
  allocator_type local_69;
  TestTextureCube *local_68;
  TextureCube *local_60;
  CompressedTexFormat *local_58;
  long local_50;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> levels;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCube_00bcdf88;
  levels.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)tcu::getUncompressedFormat(*format);
  local_60 = &this->m_texture;
  tcu::TextureCube::TextureCube(local_60,(TextureFormat *)&levels,size);
  local_58 = format;
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (&levels,(((long)(this->m_texture).m_access[0].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_texture).m_access[0].
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28) * 0x600000000 >> 0x20
             ,&local_69);
  lVar13 = 0;
  lVar12 = 0;
  local_68 = this;
  while( true ) {
    this_00 = local_68;
    iVar9 = (*(local_68->super_TestTexture)._vptr_TestTexture[2])(local_68);
    if (iVar9 <= lVar12) break;
    local_50 = lVar13;
    for (lVar11 = 0; lVar11 != 0x18; lVar11 = lVar11 + 4) {
      face = *(CubeFace *)((long)&tcuFaceMapping + lVar11);
      tcu::TextureCube::allocLevel(local_60,face,(int)lVar12);
      pPVar4 = (this->m_texture).m_access[face].
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar13 >> 0x20;
      levels.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar10].super_ConstPixelBufferAccess.m_data =
           pPVar4[lVar12].super_ConstPixelBufferAccess.m_data;
      pTVar1 = (TextureFormat *)(pPVar4 + lVar12);
      TVar5 = *pTVar1;
      CVar7 = pTVar1[1].order;
      CVar8 = pTVar1[1].type;
      piVar2 = pPVar4[lVar12].super_ConstPixelBufferAccess.m_size.m_data + 2;
      uVar6 = *(undefined8 *)(piVar2 + 2);
      piVar3 = levels.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10].super_ConstPixelBufferAccess.m_size.
               m_data + 2;
      *(undefined8 *)piVar3 = *(undefined8 *)piVar2;
      *(undefined8 *)(piVar3 + 2) = uVar6;
      pPVar4 = levels.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar10;
      (pPVar4->super_ConstPixelBufferAccess).m_format = TVar5;
      (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0] = CVar7;
      (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1] = CVar8;
      lVar13 = lVar13 + 0x100000000;
    }
    lVar12 = lVar12 + 1;
    lVar13 = local_50 + 0x600000000;
  }
  TestTexture::populateCompressedLevels(&this_00->super_TestTexture,*local_58,&levels);
  std::_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~_Vector_base
            (&levels.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>);
  return;
}

Assistant:

TestTextureCube::TestTextureCube (const tcu::CompressedTexFormat& format, int size)
	: TestTexture	(format, size, size, 1)
	, m_texture		(tcu::getUncompressedFormat(format), size)
{
	std::vector<tcu::PixelBufferAccess> levels(m_texture.getNumLevels() * tcu::CUBEFACE_LAST);

	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			m_texture.allocLevel(tcuFaceMapping[faceNdx], levelNdx);
			levels[levelNdx * tcu::CUBEFACE_LAST + faceNdx] = m_texture.getLevelFace(levelNdx, tcuFaceMapping[faceNdx]);
		}
	}

	TestTexture::populateCompressedLevels(format, levels);
}